

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall gl4cts::GLSL420Pack::NegativeTestBase::testCompute(NegativeTestBase *this)

{
  shaderCompilationException *exc;
  programLinkageException *exc_1;
  shaderSource local_f0;
  shaderSource local_d0;
  shaderSource local_b0;
  shaderSource local_90;
  undefined1 local_60 [8];
  shaderSource conmpute_data;
  program program;
  NegativeTestBase *this_local;
  
  Utils::program::program
            ((program *)&conmpute_data.m_use_lengths,(this->super_TestBase).super_TestCase.m_context
            );
  Utils::shaderSource::shaderSource((shaderSource *)local_60);
  TestBase::initShaderSource(&this->super_TestBase,COMPUTE_SHADER,false,(shaderSource *)local_60);
  Utils::shaderSource::shaderSource(&local_90,(GLchar *)0x0);
  Utils::shaderSource::shaderSource(&local_b0,(GLchar *)0x0);
  Utils::shaderSource::shaderSource(&local_d0,(GLchar *)0x0);
  Utils::shaderSource::shaderSource(&local_f0,(GLchar *)0x0);
  Utils::shaderSource::shaderSource((shaderSource *)&exc_1,(GLchar *)0x0);
  Utils::program::build
            ((program *)&conmpute_data.m_use_lengths,(shaderSource *)local_60,&local_90,&local_b0,
             &local_d0,&local_f0,(shaderSource *)&exc_1,(GLchar **)0x0,0,false);
  Utils::shaderSource::~shaderSource((shaderSource *)&exc_1);
  Utils::shaderSource::~shaderSource(&local_f0);
  Utils::shaderSource::~shaderSource(&local_d0);
  Utils::shaderSource::~shaderSource(&local_b0);
  Utils::shaderSource::~shaderSource(&local_90);
  Utils::shaderSource::~shaderSource((shaderSource *)local_60);
  Utils::program::~program((program *)&conmpute_data.m_use_lengths);
  return false;
}

Assistant:

bool NegativeTestBase::testCompute()
{
	/* GL objects */
	Utils::program program(m_context);

	/* Shaders */
	Utils::shaderSource conmpute_data;
	initShaderSource(Utils::COMPUTE_SHADER, false, conmpute_data);

	/* Build program */
	try
	{
		program.build(conmpute_data /* compute shader */, 0 /* fragment shader */, 0 /* geometry shader */,
					  0 /* tesselation control shader */, 0 /* tesselation evaluation shader */, 0 /* vertex shader */,
					  0 /* varying names */, 0 /* n varying names */, false);
	}
	catch (Utils::shaderCompilationException& exc)
	{
		/* Compilation failed, as expected. Verify that reason of failure is as expected */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Shader compilation error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}
	catch (Utils::programLinkageException& exc)
	{
		/* Something wrong with linking, test case failed */
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Program linking failed. Error message: " << exc.m_error_message
											<< tcu::TestLog::EndMessage;
		return true;
	}

	/* Build process succeded */
	return false;
}